

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

int covscript_args(int args_size,char **args)

{
  char *__s1;
  bool bVar1;
  undefined *puVar2;
  int iVar3;
  long *plVar4;
  int *piVar5;
  ulong size;
  bool *pbVar6;
  fatal_error *pfVar7;
  undefined8 uVar8;
  size_type *psVar9;
  int iVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  _Alloc_hider __nptr;
  int iVar12;
  ulong uVar13;
  int local_c0;
  int local_bc;
  string local_b8;
  allocator local_91;
  undefined8 local_90;
  string local_88;
  char **local_68;
  string local_60;
  int local_3c;
  ulong local_38;
  
  iVar10 = 1;
  if (1 < args_size) {
    local_38 = (ulong)(uint)args_size;
    local_90 = 0;
    uVar13 = 1;
    iVar10 = 2;
    local_c0 = 0;
    local_bc = 0;
    iVar12 = 0;
    local_68 = args;
    do {
      puVar2 = cs::current_process;
      paVar11 = &local_b8.field_2;
      if (iVar12 == 1) {
        std::__cxx11::string::string((string *)&local_60,local_68[uVar13],(allocator *)&local_88);
        cs::process_path(&local_b8,&local_60);
        std::__cxx11::string::operator=((string *)&csym_path_abi_cxx11_,(string *)&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar11) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        iVar12 = 2;
      }
      else if (local_bc == 1) {
        std::__cxx11::string::string((string *)&local_60,local_68[uVar13],(allocator *)&local_88);
        cs::process_path(&local_b8,&local_60);
        std::__cxx11::string::operator=((string *)&log_path_abi_cxx11_,(string *)&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar11) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        local_bc = 2;
      }
      else if (local_c0 == 1) {
        std::__cxx11::string::string((string *)&local_88,local_68[uVar13],&local_91);
        cs::process_path(&local_60,&local_88);
        plVar4 = (long *)std::__cxx11::string::insert((ulong)&local_60,0,'\x01');
        psVar9 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_b8.field_2._M_allocated_capacity = *psVar9;
          local_b8.field_2._8_8_ = plVar4[3];
          local_b8._M_dataplus._M_p = (pointer)paVar11;
        }
        else {
          local_b8.field_2._M_allocated_capacity = *psVar9;
          local_b8._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_b8._M_string_length = plVar4[1];
        *plVar4 = (long)psVar9;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append(cs::current_process + 0x58,(ulong)local_b8._M_dataplus._M_p)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar11) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        local_c0 = 2;
      }
      else if ((int)local_90 == 1) {
        local_3c = iVar12;
        std::__cxx11::string::string((string *)&local_b8,local_68[uVar13],(allocator *)&local_88);
        __nptr._M_p = local_b8._M_dataplus._M_p;
        piVar5 = __errno_location();
        iVar12 = *piVar5;
        *piVar5 = 0;
        size = strtoul(__nptr._M_p,(char **)&local_60,10);
        if (local_60._M_dataplus._M_p == __nptr._M_p) {
          std::__throw_invalid_argument("stoul");
          goto LAB_00121c36;
        }
        if (*piVar5 == 0) {
          *piVar5 = iVar12;
        }
        else if (*piVar5 == 0x22) {
          uVar8 = std::__throw_out_of_range("stoul");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          _Unwind_Resume(uVar8);
        }
        *(ulong *)(puVar2 + 0x78) = size;
        cs::stack_type<cs_impl::any,_std::allocator>::resize
                  ((stack_type<cs_impl::any,_std::allocator> *)(puVar2 + 0x80),size);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        local_90 = 2;
        iVar12 = local_3c;
      }
      else {
        __s1 = local_68[uVar13];
        if (*__s1 != '-') {
          iVar10 = (int)uVar13;
          goto LAB_00121bf1;
        }
        iVar3 = strcmp(__s1,"--args");
        if ((iVar3 == 0) || ((__s1[1] == 'a' && (__s1[2] == '\0')))) {
          repl = true;
          return iVar10;
        }
        iVar3 = strcmp(__s1,"--silent");
        if (((iVar3 == 0) || ((__s1[1] == 's' && (__s1[2] == '\0')))) && (silent == false)) {
          pbVar6 = &silent;
        }
        else {
          iVar3 = strcmp(__s1,"--dump-ast");
          if (((iVar3 == 0) || ((__s1[1] == 'd' && (__s1[2] == '\0')))) && (dump_ast == false)) {
            pbVar6 = &dump_ast;
          }
          else {
            iVar3 = strcmp(__s1,"--dependency");
            if (((iVar3 == 0) || ((__s1[1] == 'r' && (__s1[2] == '\0')))) &&
               (dump_dependency == false)) {
              pbVar6 = &dump_dependency;
            }
            else {
              iVar3 = strcmp(__s1,"--no-optimize");
              if (((iVar3 == 0) || ((__s1[1] == 'o' && (__s1[2] == '\0')))) &&
                 (no_optimize == false)) {
                pbVar6 = &no_optimize;
              }
              else {
                iVar3 = strcmp(__s1,"--compile-only");
                if (((iVar3 == 0) || ((__s1[1] == 'c' && (__s1[2] == '\0')))) &&
                   (compile_only == false)) {
                  pbVar6 = &compile_only;
                }
                else {
                  iVar3 = strcmp(__s1,"--help");
                  if (((iVar3 == 0) || ((__s1[1] == 'h' && (__s1[2] == '\0')))) &&
                     (show_help_info == false)) {
                    pbVar6 = &show_help_info;
                  }
                  else {
                    iVar3 = strcmp(__s1,"--wait-before-exit");
                    if (((iVar3 == 0) || ((__s1[1] == 'w' && (__s1[2] == '\0')))) &&
                       (wait_before_exit == false)) {
                      pbVar6 = &wait_before_exit;
                    }
                    else {
                      iVar3 = strcmp(__s1,"--version");
                      if (((iVar3 != 0) && ((__s1[1] != 'v' || (__s1[2] != '\0')))) ||
                         (show_version_info != false)) {
                        iVar3 = strcmp(__s1,"--csym");
                        if (iVar3 == 0) {
                          if (iVar12 != 0) goto LAB_00121a9c;
                        }
                        else if ((__s1[1] != 'g') || (__s1[2] != '\0' || iVar12 != 0)) {
LAB_00121a9c:
                          iVar3 = strcmp(__s1,"--log-path");
                          if (iVar3 == 0) {
                            if (local_bc != 0) goto LAB_00121b05;
                          }
                          else if ((__s1[1] != 'l') || (__s1[2] != '\0' || local_bc != 0)) {
LAB_00121b05:
                            iVar3 = strcmp(__s1,"--import-path");
                            if (iVar3 == 0) {
                              if (local_c0 != 0) goto LAB_00121b42;
                            }
                            else if ((__s1[1] != 'i') || (__s1[2] != '\0' || local_c0 != 0)) {
LAB_00121b42:
                              iVar3 = strcmp(__s1,"--stack-resize");
                              if (((iVar3 != 0) &&
                                  ((uVar8 = local_90, __s1[1] != 'S' || (__s1[2] != '\0')))) ||
                                 (bVar1 = (int)local_90 != 0, local_90 = 1, uVar8 = 1, bVar1)) {
                                local_90 = uVar8;
                                pfVar7 = (fatal_error *)__cxa_allocate_exception(0x28);
                                local_b8._M_dataplus._M_p = (pointer)paVar11;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_b8,"argument syntax error.","");
                                cs::fatal_error::fatal_error(pfVar7,&local_b8);
                                __cxa_throw(pfVar7,&cs::fatal_error::typeinfo,
                                            cs::fatal_error::~fatal_error);
                              }
                              goto LAB_00121ae1;
                            }
                            local_c0 = 1;
                            goto LAB_00121ae1;
                          }
                          local_bc = 1;
                          goto LAB_00121ae1;
                        }
                        iVar12 = 1;
                        goto LAB_00121ae1;
                      }
                      pbVar6 = &show_version_info;
                    }
                  }
                }
              }
            }
          }
        }
        *pbVar6 = true;
      }
LAB_00121ae1:
      uVar13 = uVar13 + 1;
      iVar10 = iVar10 + 1;
    } while (local_38 != uVar13);
    iVar10 = (int)local_38;
LAB_00121bf1:
    __nptr._M_p = (pointer)&local_b8.field_2;
    if (((iVar12 == 1) || (local_bc == 1)) || (local_c0 == 1)) {
LAB_00121c36:
      pfVar7 = (fatal_error *)__cxa_allocate_exception(0x28);
      local_b8._M_dataplus._M_p = __nptr._M_p;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"argument syntax error.","");
      cs::fatal_error::fatal_error(pfVar7,&local_b8);
      __cxa_throw(pfVar7,&cs::fatal_error::typeinfo,cs::fatal_error::~fatal_error);
    }
  }
  return iVar10;
}

Assistant:

int covscript_args(int args_size, char *args[])
{
	int expect_csym = 0;
	int expect_log_path = 0;
	int expect_import_path = 0;
	int expect_stack_resize = 0;
	int index = 1;
	for (; index < args_size; ++index) {
		if (expect_csym == 1) {
			csym_path = cs::process_path(args[index]);
			expect_csym = 2;
		}
		else if (expect_log_path == 1) {
			log_path = cs::process_path(args[index]);
			expect_log_path = 2;
		}
		else if (expect_import_path == 1) {
			cs::current_process->import_path += cs::path_delimiter + cs::process_path(args[index]);
			expect_import_path = 2;
		}
		else if (expect_stack_resize == 1) {
			cs::current_process->resize_stack(std::stoul(args[index]));
			expect_stack_resize = 2;
		}
		else if (args[index][0] == '-') {
			if (std::strcmp(args[index], "--args") == 0 || std::strcmp(args[index], "-a") == 0) {
				repl = true;
				return ++index;
			}
			else if ((std::strcmp(args[index], "--silent") == 0 || std::strcmp(args[index], "-s") == 0) && !silent)
				silent = true;
			else if ((std::strcmp(args[index], "--dump-ast") == 0 || std::strcmp(args[index], "-d") == 0) && !dump_ast)
				dump_ast = true;
			else if ((std::strcmp(args[index], "--dependency") == 0 || std::strcmp(args[index], "-r") == 0) &&
			         !dump_dependency)
				dump_dependency = true;
			else if ((std::strcmp(args[index], "--no-optimize") == 0 || std::strcmp(args[index], "-o") == 0) &&
			         !no_optimize)
				no_optimize = true;
			else if ((std::strcmp(args[index], "--compile-only") == 0 || std::strcmp(args[index], "-c") == 0) &&
			         !compile_only)
				compile_only = true;
			else if ((std::strcmp(args[index], "--help") == 0 || std::strcmp(args[index], "-h") == 0) &&
			         !show_help_info)
				show_help_info = true;
			else if ((std::strcmp(args[index], "--wait-before-exit") == 0 || std::strcmp(args[index], "-w") == 0) &&
			         !wait_before_exit)
				wait_before_exit = true;
			else if ((std::strcmp(args[index], "--version") == 0 || std::strcmp(args[index], "-v") == 0) &&
			         !show_version_info)
				show_version_info = true;
			else if ((std::strcmp(args[index], "--csym") == 0 || std::strcmp(args[index], "-g") == 0) &&
			         expect_csym == 0)
				expect_csym = 1;
			else if ((std::strcmp(args[index], "--log-path") == 0 || std::strcmp(args[index], "-l") == 0) &&
			         expect_log_path == 0)
				expect_log_path = 1;
			else if ((std::strcmp(args[index], "--import-path") == 0 || std::strcmp(args[index], "-i") == 0) &&
			         expect_import_path == 0)
				expect_import_path = 1;
			else if ((std::strcmp(args[index], "--stack-resize") == 0 || std::strcmp(args[index], "-S") == 0) &&
			         expect_stack_resize == 0)
				expect_stack_resize = 1;
			else
				throw cs::fatal_error("argument syntax error.");
		}
		else
			break;
	}
	if (expect_csym == 1 || expect_log_path == 1 || expect_import_path == 1 || expect_import_path == 1)
		throw cs::fatal_error("argument syntax error.");
	return index;
}